

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::RecurseError(Parser *this)

{
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  NumToString<int>(&local_38,*(int *)((long)&in_RSI[0x3b].field_2 + 0xc));
  std::operator+(&bStack_78,"maximum parsing depth ",&local_38);
  std::operator+(&local_58,&bStack_78," reached");
  Error(this,in_RSI);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::RecurseError() {
  return Error("maximum parsing depth " + NumToString(parse_depth_counter_) +
               " reached");
}